

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::parse_str_into(char *ext,char *str,size_t len,int radix)

{
  ushort uVar1;
  CVmBigNumCacheReg *pCVar2;
  CVmBigNumCache *pCVar3;
  uint16_t tmp;
  wchar_t wVar4;
  int iVar5;
  ushort *new_ext;
  ulong uVar6;
  uint uVar7;
  undefined8 uVar8;
  undefined8 extraout_RDX;
  ushort *puVar9;
  ushort *ext_00;
  ulong __n;
  byte *p;
  byte *p_00;
  bool bVar10;
  uint thdl;
  char dreg [7];
  uint local_54;
  char local_50 [8];
  ushort *local_48;
  undefined8 local_40;
  ulong local_38;
  
  if (radix == 0) {
    radix = radix_from_string(str,len);
    bVar10 = radix == 0x10;
  }
  else {
    bVar10 = false;
  }
  if (radix == 10) {
    parse_str_into(ext,str,len);
    return;
  }
  uVar1 = *(ushort *)ext;
  ext[4] = ext[4] & 0xf9;
  __n = (ulong)(uVar1 + 1 >> 1);
  uVar8 = 0;
  local_48 = (ushort *)ext;
  memset(ext + 5,0,__n);
  p_00 = (byte *)str;
  if (len != 0) {
    do {
      wVar4 = utf8_ptr::s_getch((char *)p_00);
      if ((0x7f < (uint)wVar4) || (iVar5 = isspace(wVar4), iVar5 == 0)) {
        wVar4 = utf8_ptr::s_getch((char *)p_00);
        uVar8 = 0;
        if (wVar4 == L'+') {
LAB_0023631b:
          len = (size_t)(p_00 + (len - (long)(p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 &
                                                            (uint)(*p_00 >> 7) * 3) + 1)));
          p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1;
        }
        else {
          wVar4 = utf8_ptr::s_getch((char *)p_00);
          uVar8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
          if (wVar4 == L'-') goto LAB_0023631b;
          uVar8 = 0;
        }
        p = p_00;
        if ((byte *)len != (byte *)0x0) goto LAB_00236351;
        len = 0;
        goto LAB_002363a2;
      }
      uVar8 = 0;
      str = (char *)(p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1);
      len = (size_t)(p_00 + (len - (long)str));
      p_00 = (byte *)str;
    } while ((byte *)len != (byte *)0x0);
  }
  goto LAB_0023639f;
  while( true ) {
    str = (char *)(p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1);
    len = (size_t)(p + (len - (long)str));
    p = (byte *)str;
    if ((byte *)len == (byte *)0x0) break;
LAB_00236351:
    wVar4 = utf8_ptr::s_getch((char *)p);
    if ((0x7f < (uint)wVar4) || (iVar5 = isspace(wVar4), iVar5 == 0)) {
      p_00 = p;
      if (((bVar10) && (wVar4 = utf8_ptr::s_getch((char *)p), wVar4 == L'0')) &&
         ((wVar4 = utf8_ptr::s_getch_at((char *)p,1), wVar4 == L'x' ||
          (wVar4 = utf8_ptr::s_getch_at((char *)p,1), wVar4 == L'X')))) {
        uVar6 = (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3);
        p_00 = p + (((p[uVar6 + 1] >> 5 & 1) != 0) + 1 & (uint)(p[uVar6 + 1] >> 7) * 3) + uVar6 + 2;
        len = (size_t)(p + (len - (long)p_00));
      }
      goto LAB_002363a2;
    }
  }
LAB_0023639f:
  len = 0;
  p_00 = (byte *)str;
LAB_002363a2:
  new_ext = (ushort *)CVmBigNumCache::alloc_reg(S_bignum_cache,__n + 5,&local_54);
  if (new_ext != (ushort *)0x0) {
    *new_ext = uVar1;
    *(undefined1 *)(new_ext + 2) = 0;
  }
  puVar9 = local_48;
  if ((byte *)len != (byte *)0x0) {
    local_38 = (ulong)(uint)radix;
    bVar10 = false;
    ext_00 = local_48;
    local_40 = uVar8;
    do {
      wVar4 = utf8_ptr::s_getch((char *)p_00);
      uVar7 = wVar4 + L'\xffffffd0';
      if (9 < uVar7) {
        if ((uint)(wVar4 + L'\xffffffbf') < 0x1a) {
          uVar7 = wVar4 + L'\xffffffc9';
        }
        else {
          if (0x19 < (uint)(wVar4 + L'\xffffff9f')) break;
          uVar7 = wVar4 + L'\xffffffa9';
        }
      }
      if (radix <= (int)uVar7) break;
      if (wVar4 != L'0') {
        bVar10 = true;
      }
      puVar9 = new_ext;
      if (bVar10) {
        local_50[4] = '\0';
        local_50[5] = '\0';
        local_50[6] = '\0';
        local_50[0] = '\x02';
        local_50[1] = '\0';
        local_50[2] = '\0';
        local_50[3] = '\0';
        set_uint_val(local_50,(ulong)uVar7);
        mul_by_long((char *)ext_00,local_38);
        compute_abs_sum_into((char *)new_ext,(char *)ext_00,local_50);
        puVar9 = ext_00;
        ext_00 = new_ext;
      }
      len = (size_t)(p_00 + (len - (long)(p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 &
                                                        (uint)(*p_00 >> 7) * 3) + 1)));
      new_ext = puVar9;
      p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1;
    } while ((byte *)len != (byte *)0x0);
    uVar8 = local_40;
    puVar9 = local_48;
    if (ext_00 != local_48) {
      copy_val((char *)local_48,(char *)ext_00,0);
    }
  }
  pCVar3 = S_bignum_cache;
  pCVar2 = S_bignum_cache->reg_;
  pCVar2[local_54].nxt_ = S_bignum_cache->free_reg_;
  pCVar3->free_reg_ = pCVar2 + local_54;
  *(byte *)(puVar9 + 2) = (byte)puVar9[2] & 0xfe | (byte)uVar8;
  return;
}

Assistant:

void CVmObjBigNum::parse_str_into(char *ext, const char *str, size_t len,
                                  int radix)
{
    /* if the radix is 0, infer the radix from the string */
    int inferred_radix = 0;
    if (radix == 0)
        radix = inferred_radix = radix_from_string(str, len);
    
    /* if it's decimal, parse as a floating point value */
    if (radix == 10)
    {
        parse_str_into(ext, str, len);
        return;
    }

    /* get the precision */
    size_t prec = get_prec(ext);

    /* set the initial value to zero */
    set_type(ext, VMBN_T_NUM);
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a sign */
    int neg = FALSE;
    if (rem != 0 && p.getch() == '+')
    {
        /* skip the sign */
        p.inc(&rem);
    }
    else if (rem != 0 && p.getch() == '-')
    {
        /* note the sign and skip it */
        neg = TRUE;
        p.inc(&rem);
    }

    /* skip spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* if we inferred the radix as hax, skip any '0x' marker */
    if (inferred_radix == 16
        && rem != 0
        && p.getch() == '0'
        && (p.getch_at(1) == 'x' || p.getch_at(1) == 'X'))
    {
        /* skip the '0x' prefix */
        p.inc(&rem);
        p.inc(&rem);
    }

    /* allocate a temporary register for swapping with the accumulator */
    uint thdl;
    char *tmp = alloc_temp_reg(prec, &thdl);
    char *t1 = ext, *t2 = tmp;

    /* parse the digits */
    int significant = FALSE;
    for ( ; rem != 0 ; p.inc(&rem))
    {
        /* get the next character */
        wchar_t ch = p.getch();

        /* get the digit value of this character */
        int d;
        if (ch >= '0' && ch <= '9')
            d = ch - '0';
        else if (ch >= 'A' && ch <= 'Z')
            d = ch - 'A' + 10;
        else if (ch >= 'a' && ch <= 'z')
            d = ch - 'a' + 10;
        else
            break;

        /* if the digit isn't within the radix, it's not a digit after all */
        if (d >= radix)
            break;

        /* if it's not a leading zero, it's significant */
        if (ch != '0')
            significant = TRUE;

        /* if it's a significant digit, add it to the accumulator */
        if (significant)
        {
            /* 
             *   Set up a stack register with the digit value.  The radix can
             *   be up to 36, so the digit value can be up to 35, so we need
             *   up to two decimal digits to represent the digit value. 
             */
            char dreg[5 + 2] = { 2, 0, 0, 0, 0 };
            set_uint_val(dreg, d);

            /* shift the accumulator and add the digit */
            mul_by_long(t1, radix);
            compute_abs_sum_into(t2, t1, dreg);

            /* swap the accumulators */
            char *tt = t1;
            t1 = t2;
            t2 = tt;
        }
    }

    /* if we ended up with the value in 'tmp', copy it into our result */
    if (t1 != ext)
        copy_val(ext, t1, FALSE);

    /* free our temporary register */
    release_temp_reg(thdl);

    /* set the sign */
    set_neg(ext, neg);
}